

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangle.hpp
# Opt level: O1

bool __thiscall
triangle<double>::is_hit
          (triangle<double> *this,ray<double> *r,double *t_min,double *t_max,hit_rec<double> *rec)

{
  bool bVar1;
  uint uVar2;
  double dVar3;
  double dVar4;
  double dVar6;
  undefined1 auVar5 [16];
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  
  dVar10 = (this->v0_).e[0];
  dVar11 = (this->v1_).e[0] - dVar10;
  dVar12 = (this->v0_).e[1];
  dVar13 = (this->v0_).e[2];
  dVar14 = (this->v1_).e[1] - dVar12;
  dVar15 = (this->v1_).e[2] - dVar13;
  dVar3 = (this->v2_).e[1] - dVar12;
  dVar4 = (this->v2_).e[2] - dVar13;
  dVar6 = (this->v2_).e[0] - dVar10;
  dVar8 = (r->dir_).e[0];
  dVar17 = (r->dir_).e[1];
  dVar18 = (r->dir_).e[2];
  dVar16 = dVar17 * dVar4 - dVar3 * dVar18;
  dVar19 = dVar18 * dVar6 - dVar4 * dVar8;
  dVar7 = dVar8 * dVar3 - dVar6 * dVar17;
  dVar9 = dVar15 * dVar7 + dVar11 * dVar16 + dVar14 * dVar19;
  if (1e-06 <= ABS(dVar9)) {
    dVar9 = 1.0 / dVar9;
    dVar10 = (r->o_).e[0] - dVar10;
    dVar12 = (r->o_).e[1] - dVar12;
    dVar13 = (r->o_).e[2] - dVar13;
    dVar7 = (dVar7 * dVar13 + dVar16 * dVar10 + dVar19 * dVar12) * dVar9;
    bVar1 = false;
    if (0.0 <= dVar7) {
      if (dVar7 <= 1.0) {
        dVar16 = dVar12 * dVar15 - dVar14 * dVar13;
        dVar13 = dVar13 * dVar11 - dVar15 * dVar10;
        dVar12 = dVar10 * dVar14 - dVar11 * dVar12;
        dVar10 = (dVar18 * dVar12 + dVar8 * dVar16 + dVar17 * dVar13) * dVar9;
        bVar1 = false;
        if ((0.0 <= dVar10) && (bVar1 = false, dVar7 + dVar10 <= 1.0)) {
          dVar9 = dVar9 * (dVar12 * dVar4 + dVar16 * dVar6 + dVar13 * dVar3);
          bVar1 = false;
          if ((*t_min <= dVar9) && (dVar9 < *t_max || dVar9 == *t_max)) {
            rec->u = dVar7;
            rec->v = dVar10;
            rec->t = dVar9;
            dVar8 = dVar11 * dVar3 - dVar6 * dVar14;
            dVar17 = dVar14 * dVar4 - dVar3 * dVar15;
            dVar18 = dVar15 * dVar6 - dVar4 * dVar11;
            dVar10 = dVar8 * dVar8 + dVar17 * dVar17 + dVar18 * dVar18;
            if (dVar10 < 0.0) {
              dVar10 = sqrt(dVar10);
            }
            else {
              dVar10 = SQRT(dVar10);
            }
            dVar10 = 1.0 / dVar10;
            dVar8 = dVar8 * dVar10;
            dVar17 = dVar17 * dVar10;
            dVar18 = dVar18 * dVar10;
            dVar10 = (r->dir_).e[2] * dVar8 + (r->dir_).e[0] * dVar17 + dVar18 * (r->dir_).e[1];
            rec->front = dVar10 < 0.0;
            if (0.0 <= dVar10) {
              dVar8 = -dVar8;
            }
            uVar2 = (uint)(dVar10 < 0.0);
            auVar5._0_8_ = CONCAT44((int)(uVar2 << 0x1f) >> 0x1f,(int)(uVar2 << 0x1f) >> 0x1f);
            auVar5._8_4_ = (int)(uVar2 << 0x1f) >> 0x1f;
            auVar5._12_4_ = (int)(uVar2 << 0x1f) >> 0x1f;
            (rec->n).e[0] = (double)(~auVar5._0_8_ & (ulong)-dVar17 | (ulong)dVar17 & auVar5._0_8_);
            (rec->n).e[1] = (double)(~auVar5._8_8_ & (ulong)-dVar18 | (ulong)dVar18 & auVar5._8_8_);
            (rec->n).e[2] = dVar8;
            (rec->mat).super___shared_ptr<material<double>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (this->mat).super___shared_ptr<material<double>,_(__gnu_cxx::_Lock_policy)2>._M_ptr
            ;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                      (&(rec->mat).super___shared_ptr<material<double>,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount,
                       &(this->mat).super___shared_ptr<material<double>,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount);
            dVar10 = (r->dir_).e[2];
            dVar8 = (r->o_).e[2];
            dVar17 = (r->o_).e[1];
            dVar18 = (r->dir_).e[1];
            (rec->p).e[0] = dVar9 * (r->dir_).e[0] + (r->o_).e[0];
            (rec->p).e[1] = dVar9 * dVar18 + dVar17;
            (rec->p).e[2] = dVar10 * dVar9 + dVar8;
            bVar1 = true;
          }
        }
      }
    }
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool bound_box(const T&, const T&, BB<T>& out) const override {
    out = BB<T>(point3<T>(std::min<T>({v0_.getX(), v1_.getX(), v2_.getX()}),
                          std::min<T>({v0_.getY(), v1_.getY(), v2_.getY()}),
                          std::min<T>({v0_.getZ(), v1_.getZ(), v2_.getZ()})),
                point3<T>(std::max<T>({v0_.getX(), v1_.getX(), v2_.getX()}),
                          std::max<T>({v0_.getY(), v1_.getY(), v2_.getY()}),
                          std::max<T>({v0_.getZ(), v1_.getZ(), v2_.getZ()})));
    return true;
  }